

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# minja.hpp
# Opt level: O3

Value * __thiscall minja::Context::at(Context *this,Value *key)

{
  element_type *peVar1;
  bool bVar2;
  int iVar3;
  Value *pVVar4;
  undefined4 extraout_var;
  runtime_error *this_00;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  bVar2 = Value::contains(&this->values_,key);
  if (bVar2) {
    pVVar4 = Value::at(&this->values_,key);
    return pVVar4;
  }
  peVar1 = (this->parent_).super___shared_ptr<minja::Context,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
  if (peVar1 != (element_type *)0x0) {
    iVar3 = (*peVar1->_vptr_Context[3])(peVar1,key);
    return (Value *)CONCAT44(extraout_var,iVar3);
  }
  this_00 = (runtime_error *)__cxa_allocate_exception(0x10);
  Value::dump_abi_cxx11_(&local_60,key,-1,false);
  std::operator+(&local_40,"Undefined variable: ",&local_60);
  std::runtime_error::runtime_error(this_00,(string *)&local_40);
  __cxa_throw(this_00,&std::runtime_error::typeinfo,std::runtime_error::~runtime_error);
}

Assistant:

virtual Value & at(const Value & key) {
        if (values_.contains(key)) return values_.at(key);
        if (parent_) return parent_->at(key);
        throw std::runtime_error("Undefined variable: " + key.dump());
    }